

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  float local_94;
  double local_90;
  float local_84;
  double local_80;
  float local_78;
  bool local_71;
  double v_new_off_f;
  float zero_point_snap_R;
  float zero_point_snap_L;
  float zero_point_center;
  float t_with_flip;
  double v_max_fudged;
  double v_min_fudged;
  double dStack_40;
  bool flipped;
  double result;
  float fStack_30;
  bool is_decimal;
  float zero_deadzone_halfsize_local;
  float logarithmic_zero_epsilon_local;
  bool is_logarithmic_local;
  double v_max_local;
  double v_min_local;
  float t_local;
  ImGuiDataType data_type_local;
  
  if ((v_min != v_max) || (NAN(v_min) || NAN(v_max))) {
    local_71 = data_type == 8 || data_type == 9;
    result._3_1_ = local_71;
    result._4_4_ = zero_deadzone_halfsize;
    fStack_30 = logarithmic_zero_epsilon;
    zero_deadzone_halfsize_local._3_1_ = is_logarithmic;
    _logarithmic_zero_epsilon_local = v_max;
    v_max_local = v_min;
    v_min_local._0_4_ = t;
    v_min_local._4_4_ = data_type;
    if (is_logarithmic) {
      dStack_40 = v_min;
      if ((0.0 < t) && (dStack_40 = v_max, t < 1.0)) {
        v_min_fudged._7_1_ = v_max < v_min;
        dVar3 = ImAbs(v_min);
        if ((double)fStack_30 <= dVar3) {
          local_80 = v_max_local;
        }
        else {
          if (0.0 <= v_max_local) {
            local_78 = fStack_30;
          }
          else {
            local_78 = -fStack_30;
          }
          local_80 = (double)local_78;
        }
        v_max_fudged = local_80;
        dVar3 = ImAbs(_logarithmic_zero_epsilon_local);
        if ((double)fStack_30 <= dVar3) {
          local_90 = _logarithmic_zero_epsilon_local;
        }
        else {
          if (0.0 <= _logarithmic_zero_epsilon_local) {
            local_84 = fStack_30;
          }
          else {
            local_84 = -fStack_30;
          }
          local_90 = (double)local_84;
        }
        _zero_point_center = local_90;
        if ((v_min_fudged._7_1_ & 1) != 0) {
          ImSwap<double>(&v_max_fudged,(double *)&zero_point_center);
        }
        dVar3 = v_max_fudged;
        if (((_logarithmic_zero_epsilon_local == 0.0) && (!NAN(_logarithmic_zero_epsilon_local))) &&
           (v_max_local < 0.0)) {
          _zero_point_center = (double)-fStack_30;
        }
        if ((v_min_fudged._7_1_ & 1) == 0) {
          local_94 = v_min_local._0_4_;
        }
        else {
          local_94 = 1.0 - v_min_local._0_4_;
        }
        if (0.0 <= v_max_local * _logarithmic_zero_epsilon_local) {
          if ((v_max_local < 0.0) || (_logarithmic_zero_epsilon_local < 0.0)) {
            dVar3 = -_zero_point_center;
            dVar4 = ImPow(-v_max_fudged / -_zero_point_center,(double)(1.0 - local_94));
            dStack_40 = -(dVar3 * dVar4);
          }
          else {
            dStack_40 = ImPow(_zero_point_center / v_max_fudged,(double)local_94);
            dStack_40 = dVar3 * dStack_40;
          }
        }
        else {
          dVar3 = ImMin<double>(v_max_local,_logarithmic_zero_epsilon_local);
          fVar1 = ImAbs((float)_logarithmic_zero_epsilon_local - (float)v_max_local);
          fVar1 = -(float)dVar3 / fVar1;
          fVar2 = fVar1 + result._4_4_;
          if ((local_94 < fVar1 - result._4_4_) || (fVar2 < local_94)) {
            if (fVar1 <= local_94) {
              dVar3 = (double)fStack_30;
              dStack_40 = ImPow(_zero_point_center / (double)fStack_30,
                                (double)((local_94 - fVar2) / (1.0 - fVar2)));
              dStack_40 = dVar3 * dStack_40;
            }
            else {
              dVar3 = (double)fStack_30;
              dVar4 = ImPow(-v_max_fudged / (double)fStack_30,
                            (double)(1.0 - local_94 / (fVar1 - result._4_4_)));
              dStack_40 = -(dVar3 * dVar4);
            }
          }
          else {
            dStack_40 = 0.0;
          }
        }
      }
    }
    else if (data_type == 8 || data_type == 9) {
      dStack_40 = ImLerp<double>(v_min,v_max,t);
    }
    else {
      dStack_40 = v_max;
      if (t < 1.0) {
        dStack_40 = v_min + (v_max - v_min) * (double)t +
                            (double)(~-(ulong)(v_max < v_min) & 0x3fe0000000000000 |
                                    (ulong)((uint)(-(ulong)(v_max < v_min) >> 0x20) & 0xbfe00000) <<
                                    0x20);
      }
    }
    _t_local = dStack_40;
  }
  else {
    _t_local = 0.0;
  }
  return _t_local;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return (TYPE)0.0f;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_decimal)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}